

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O3

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint in_XMM4_Db;
  uint in_XMM4_Dc;
  uint in_XMM4_Dd;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_e0;
  float local_bc;
  float local_b8;
  double local_a0;
  double local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  float local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0xc,3,4);
  uVar3 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (((((long)uVar3 < 1) || (uVar3 == 1)) || (uVar3 < 3)) || (uVar3 == 3)) {
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  pdVar4 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  fVar7 = (float)*pdVar4;
  fVar9 = (float)pdVar4[1];
  fVar8 = fVar7 * fVar7 + fVar9 * fVar9;
  local_e0.m_xpr = __return_storage_ptr__;
  if (0.0001 <= ABS(fVar8)) {
    dVar1 = pdVar4[2];
    dVar2 = pdVar4[3];
    local_e0.m_row = 0;
    local_e0.m_col = 1;
    local_e0.m_currentBlockRows = 1;
    if (((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows < 1) ||
       ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols < 1)) goto LAB_0011a759;
    local_bc = SQRT(fVar8);
    local_98 = (double)(fVar7 / local_bc);
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = local_98;
    local_a0 = (double)(fVar9 / local_bc);
    local_b8 = fVar8;
    local_40 = local_a0;
    local_38 = fVar9;
    uStack_34 = in_XMM4_Db;
    uStack_30 = in_XMM4_Dc;
    uStack_2c = in_XMM4_Dd;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_e0,&local_40);
    local_48 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_50 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_28 = -local_38;
    uStack_24 = uStack_34 ^ 0x80000000;
    uStack_20 = uStack_30 ^ 0x80000000;
    uStack_1c = uStack_2c ^ 0x80000000;
    local_58 = (Scalar)(local_28 / local_b8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = (Scalar)(fVar7 / local_b8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    local_68 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    local_70 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_b8 = local_b8 * local_bc;
    local_78 = (Scalar)((((float)dVar1 * local_38 - (float)dVar2 * fVar7) * local_38) / local_b8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = (Scalar)((((float)dVar2 * fVar7 + local_28 * (float)dVar1) * fVar7) / local_b8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_80);
    local_88 = local_98;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_88);
    local_90 = local_a0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_90);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "CalculateJacobian () - Error - Division by Zero - Returning zero matrix",0x47);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    local_e0.m_row = 0;
    local_e0.m_col = 1;
    local_e0.m_currentBlockRows = 1;
    if (((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows < 1) ||
       ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols < 1)) {
LAB_0011a759:
      local_e0.m_currentBlockRows = 1;
      local_e0.m_col = 1;
      local_e0.m_row = 0;
      __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                    "Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = 0.0;
    local_40 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_e0,&local_40);
    local_48 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_50 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_58 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    local_68 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    local_70 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_78 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_80);
    local_88 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_88);
    local_90 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_90);
  }
  lVar6 = ((local_e0.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols;
  if (local_e0.m_currentBlockRows + local_e0.m_row !=
      ((local_e0.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
      .m_rows) {
    if (lVar6 != 0) goto LAB_0011a73a;
    lVar6 = 0;
  }
  if (local_e0.m_col == lVar6) {
    return __return_storage_ptr__;
  }
LAB_0011a73a:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
  /**
  TODO:
    * Calculate a Jacobian here.
  */

  MatrixXd Hj(3,4);

  //recover state parameters
  float px = x_state(0);
  float py = x_state(1);
  float vx = x_state(2);
  float vy = x_state(3);

  //pre-compute a set of terms to avoid repeated calculation
  float c1 = px*px+py*py;
  float c2 = sqrt(c1);
  float c3 = (c1*c2);

  //check division by zero
  if(fabs(c1) < 0.0001){
    cout << "CalculateJacobian () - Error - Division by Zero - Returning zero matrix" << endl;
    Hj << 0, 0, 0, 0,
          0, 0, 0, 0,
          0, 0, 0, 0;
    return Hj;
  }

  //compute the Jacobian matrix
  Hj << (px/c2), (py/c2), 0, 0,
       -(py/c1), (px/c1), 0, 0,
       py*(vx*py - vy*px)/c3, px*(px*vy - py*vx)/c3, px/c2, py/c2;

  return Hj;
}